

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O2

void __thiscall
slang::SourceSnippet::SourceSnippet(SourceSnippet *this,string_view sourceLine,uint32_t tabStop)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  reference piVar5;
  ulong uVar6;
  reference pcVar7;
  char *pcVar8;
  size_t i;
  ulong uVar9;
  ulong index;
  uint32_t j;
  uint uVar10;
  byte *last;
  size_type sVar11;
  uint uVar12;
  byte *b;
  uint32_t c;
  string *local_e8;
  SourceSnippet *local_e0;
  int error;
  char buf [4];
  char local_c0 [16];
  string *local_b0;
  long local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  uint32_t local_8c;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *local_88;
  char *local_80;
  char *local_78;
  SmallVector<char,_40UL> buffer;
  
  index = sourceLine._M_len;
  (this->byteToColumn).super_SmallVectorBase<int>.data_ =
       (pointer)(this->byteToColumn).super_SmallVectorBase<int>.firstElement;
  (this->byteToColumn).super_SmallVectorBase<int>.len = 0;
  (this->byteToColumn).super_SmallVectorBase<int>.cap = 10;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.data_ =
       (pointer)(this->invalidRanges).
                super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.firstElement;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.len = 0;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.cap = 4;
  (this->snippetLine)._M_dataplus._M_p = (pointer)&(this->snippetLine).field_2;
  (this->snippetLine)._M_string_length = 0;
  local_88 = (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *)&this->invalidRanges;
  (this->snippetLine).field_2._M_local_buf[0] = '\0';
  (this->highlightLine)._M_dataplus._M_p = (pointer)&(this->highlightLine).field_2;
  (this->highlightLine)._M_string_length = 0;
  local_b0 = &this->snippetLine;
  local_e8 = (string *)&this->highlightLine;
  (this->highlightLine).field_2._M_local_buf[0] = '\0';
  local_8c = tabStop;
  if (index == 0) {
    assert::assertFailed
              ("!sourceLine.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/diagnostics/TextDiagnosticClient.cpp"
               ,0xbc,"slang::SourceSnippet::SourceSnippet(string_view, uint32_t)");
  }
  SmallVectorBase<int>::resize((SmallVectorBase<int> *)this,index + 1);
  for (uVar9 = 0; uVar9 < (this->byteToColumn).super_SmallVectorBase<int>.len; uVar9 = uVar9 + 1) {
    piVar5 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)this,uVar9);
    *piVar5 = -1;
  }
  std::__cxx11::string::reserve((ulong)local_b0);
  buffer.super_SmallVectorBase<char>.data_ = buffer.super_SmallVectorBase<char>.firstElement;
  buffer.super_SmallVectorBase<char>.len = 0;
  buffer.super_SmallVectorBase<char>.cap = 0x28;
  local_78 = sourceLine._M_str + -1;
  uVar9 = 0;
  local_a8 = 0;
  local_e0 = this;
  local_80 = sourceLine._M_str;
  do {
    pcVar8 = local_80;
    if (index < uVar9 || index - uVar9 == 0) {
      piVar5 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)local_e0,index);
      *piVar5 = (int)local_a8;
      _buf = local_c0;
      std::__cxx11::string::_M_construct((ulong)buf,(char)local_a8);
      std::__cxx11::string::operator=(local_e8,(string *)buf);
      std::__cxx11::string::~string((string *)buf);
      SmallVectorBase<char>::~SmallVectorBase(&buffer.super_SmallVectorBase<char>);
      return;
    }
    piVar5 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)local_e0,uVar9);
    *piVar5 = (int)local_a8;
    buffer.super_SmallVectorBase<char>.len = 0;
    if (pcVar8[uVar9] == '\t') {
      pcVar8 = local_78 + uVar9;
      for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        if (*pcVar8 == '\t') goto LAB_00156c16;
        pcVar8 = pcVar8 + -1;
      }
      uVar6 = uVar9 & 0xffffffff;
LAB_00156c16:
      uVar12 = local_8c - (int)((uVar6 & 0xffffffff) % (ulong)local_8c);
      uVar9 = uVar9 + 1;
      for (uVar10 = 0; sVar11 = buffer.super_SmallVectorBase<char>.len, uVar10 < uVar12;
          uVar10 = uVar10 + 1) {
        _buf = (char *)CONCAT71(stack0xffffffffffffff31,0x20);
        SmallVectorBase<char>::emplace_back<char>(&buffer.super_SmallVectorBase<char>,buf);
      }
    }
    else {
      b = (byte *)(pcVar8 + uVar9);
      if (index < uVar9 + 4) {
        _buf = (char *)((ulong)_buf & 0xffffffff00000000);
        memcpy((SmallVectorBase<char> *)buf,b,index - uVar9);
        pcVar8 = utf8Decode(buf,&c,&error);
        last = b + ((long)pcVar8 - (long)buf);
      }
      else {
        last = (byte *)utf8Decode((char *)b,&c,&error);
      }
      if (error == 0) {
        bVar3 = isPrintableUnicode(c);
        uVar9 = (long)last - (long)local_80;
        if (bVar3) {
          SmallVectorBase<char>::append<char_const*,void>
                    (&buffer.super_SmallVectorBase<char>,(char *)b,(char *)last);
          iVar4 = charWidthUnicode(c);
          sVar11 = (long)iVar4;
          goto LAB_00156df2;
        }
        _buf = local_c0 + 8;
        local_c0[0] = '\b';
        local_c0[1] = '\0';
        local_c0[2] = '\0';
        local_c0[3] = '\0';
        local_c0[4] = '\0';
        local_c0[5] = '\0';
        local_c0[6] = '\0';
        local_c0[7] = '\0';
        for (; c != 0; c = c >> 4) {
          local_a0._M_len = CONCAT71(local_a0._M_len._1_7_,"0123456789ABCDEF"[c & 0xf]);
          SmallVectorBase<char>::emplace_back<char>((SmallVectorBase<char> *)buf,(char *)&local_a0);
        }
        local_a0._M_len = 3;
        local_a0._M_str = "<U+";
        SmallVectorBase<char>::append<std::basic_string_view<char,std::char_traits<char>>>
                  (&buffer.super_SmallVectorBase<char>,&local_a0);
        local_a0._M_len = (size_t)_buf;
        local_a0._M_str = _buf;
        SmallVectorBase<char>::append<slang::iterator_range<std::reverse_iterator<char*>>>
                  (&buffer.super_SmallVectorBase<char>,
                   (iterator_range<std::reverse_iterator<char_*>_> *)&local_a0);
        local_a0._M_len = CONCAT71(local_a0._M_len._1_7_,0x3e);
        SmallVectorBase<char>::emplace_back<char>
                  (&buffer.super_SmallVectorBase<char>,(char *)&local_a0);
        sVar11 = buffer.super_SmallVectorBase<char>.len;
        SmallVectorBase<char>::~SmallVectorBase((SmallVectorBase<char> *)buf);
      }
      else {
        bVar1 = *b;
        _buf = (pointer)0x4;
        SmallVectorBase<char>::append<std::basic_string_view<char,std::char_traits<char>>>
                  (&buffer.super_SmallVectorBase<char>,
                   (basic_string_view<char,_std::char_traits<char>_> *)buf);
        cVar2 = "0123456789ABCDEF"[bVar1 >> 4];
        pcVar7 = SmallVectorBase<char>::operator[](&buffer.super_SmallVectorBase<char>,1);
        *pcVar7 = cVar2;
        cVar2 = "0123456789ABCDEF"[bVar1 & 0xf];
        pcVar7 = SmallVectorBase<char>::operator[](&buffer.super_SmallVectorBase<char>,2);
        uVar9 = uVar9 + 1;
        *pcVar7 = cVar2;
        sVar11 = buffer.super_SmallVectorBase<char>.len;
      }
      _buf = (char *)(local_e0->snippetLine)._M_string_length;
      SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
      emplace_back<std::pair<unsigned_long,unsigned_long>>
                (local_88,(pair<unsigned_long,_unsigned_long> *)buf);
    }
LAB_00156df2:
    std::__cxx11::string::append((char *)local_b0,(ulong)buffer.super_SmallVectorBase<char>.data_);
    local_a8 = local_a8 + sVar11;
  } while( true );
}

Assistant:

SourceSnippet(string_view sourceLine, uint32_t tabStop) {
        ASSERT(!sourceLine.empty());

        byteToColumn.resize(sourceLine.size() + 1);
        for (size_t i = 0; i < byteToColumn.size(); i++)
            byteToColumn[i] = -1;

        snippetLine.reserve(sourceLine.size());

        SmallVector<char> buffer;
        size_t column = 0;
        size_t i = 0;
        while (i < sourceLine.size()) {
            byteToColumn[i] = (int)column;

            size_t columnWidth;
            buffer.clear();
            if (!printableTextForNextChar(sourceLine, i, tabStop, buffer, columnWidth))
                invalidRanges.push_back({snippetLine.size(), buffer.size()});

            snippetLine.append(buffer.data(), buffer.size());
            column += columnWidth;
        }

        byteToColumn[sourceLine.size()] = (int)column;
        highlightLine = std::string(column, ' ');
    }